

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O3

void __thiscall brynet::net::DataSocket::normalFlush(DataSocket *this)

{
  element_type *peVar1;
  size_t __n;
  sock __fd;
  long *plVar2;
  void *pvVar3;
  ssize_t sVar4;
  ulong uVar5;
  int *piVar6;
  _Elt_pointer ppVar7;
  pointer __buf;
  ulong uVar8;
  pointer __src;
  _Elt_pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  _Map_pointer pppVar12;
  iterator local_70;
  iterator local_50;
  
  plVar2 = (long *)__tls_get_addr();
  if (*plVar2 == 0) {
    pvVar3 = malloc(0x8000);
    *plVar2 = (long)pvVar3;
  }
  ppVar9 = (this->mSendList).
           super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  do {
    ppVar7 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (ppVar9 == ppVar7) {
      return;
    }
    __buf = (pointer)*plVar2;
    ppVar9 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppVar12 = (this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar5 = 0;
    do {
      peVar1 = (ppVar7->data).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      __n = ppVar7->left;
      __src = (peVar1->_M_dataplus)._M_p + (peVar1->_M_string_length - __n);
      uVar11 = __n + uVar5;
      if (0x8000 < uVar11) {
        uVar11 = uVar5;
        if (ppVar7 == (this->mSendList).
                      super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          __buf = __src;
          uVar11 = __n;
        }
        break;
      }
      memcpy(__buf + uVar5,__src,__n);
      ppVar7 = ppVar7 + 1;
      if (ppVar7 == ppVar9) {
        ppVar7 = pppVar12[1];
        pppVar12 = pppVar12 + 1;
        ppVar9 = ppVar7 + 9;
      }
      uVar5 = uVar11;
    } while (ppVar7 != (this->mSendList).
                       super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
    if (uVar11 == 0) {
      return;
    }
    __fd = TcpSocket::getFD((this->mSocket)._M_t.
                            super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                            .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    sVar4 = ::send(__fd,__buf,(long)(int)uVar11,0);
    if ((int)(uint)sVar4 < 1) {
      piVar6 = __errno_location();
      if (*piVar6 != 0xb) {
        if ((this->mSocket)._M_t.
            super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>.
            _M_t.
            super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
            .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl == (TcpSocket *)0x0
           ) {
          return;
        }
        onClose(this);
        return;
      }
      break;
    }
    uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
    ppVar9 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar7 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar9 != ppVar7) {
      uVar10 = ppVar9->left;
      uVar8 = uVar5;
      if (uVar10 <= uVar5) {
        pppVar12 = (this->mSendList).
                   super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((ppVar9->mCompleteCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(ppVar9->mCompleteCallback)._M_invoker)((_Any_data *)&ppVar9->mCompleteCallback);
          }
          local_70._M_first = *pppVar12;
          local_70._M_last = local_70._M_first + 9;
          local_70._M_cur = ppVar9;
          local_70._M_node = pppVar12;
          std::
          deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
          ::_M_erase(&local_50,&this->mSendList,&local_70);
          ppVar7 = (this->mSendList).
                   super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppVar9 = local_50._M_cur;
          if (local_50._M_cur == ppVar7) goto LAB_00120e39;
          uVar8 = uVar8 - uVar10;
          uVar10 = (local_50._M_cur)->left;
          pppVar12 = local_50._M_node;
        } while (uVar10 <= uVar8);
      }
      ppVar9->left = uVar10 - uVar8;
      ppVar9 = ppVar7;
    }
LAB_00120e39:
  } while (uVar5 == uVar11);
  this->mCanWrite = false;
  checkWrite(this);
  return;
}

Assistant:

void DataSocket::normalFlush()
{
    static  const   int SENDBUF_SIZE = 1024 * 32;
    if (threadLocalSendBuf == nullptr)
    {
        threadLocalSendBuf = (char*)malloc(SENDBUF_SIZE);
    }

    bool must_close = false;

    while (!mSendList.empty())
    {
        char* sendptr = threadLocalSendBuf;
        size_t     wait_send_size = 0;

        for (auto it = mSendList.begin(); it != mSendList.end(); ++it)
        {
            auto& packet = *it;
            auto packetLeftBuf = (char*)(packet.data->c_str() + (packet.data->size() - packet.left));
            auto packetLeftLen = packet.left;

            if ((wait_send_size + packetLeftLen) > SENDBUF_SIZE)
            {
                if (it == mSendList.begin())
                {
                    sendptr = packetLeftBuf;
                    wait_send_size = packetLeftLen;
                }
                break;
            }

            memcpy(sendptr + wait_send_size, packetLeftBuf, packetLeftLen);
            wait_send_size += packetLeftLen;
        }

        if (wait_send_size <= 0)
        {
            break;
        }

        int send_retlen = 0;
#ifdef USE_OPENSSL
        if (mSSL != nullptr)
        {
            send_retlen = SSL_write(mSSL, sendptr, wait_send_size);
        }
        else
        {
            send_retlen = ::send(mSocket->getFD(), sendptr, wait_send_size, 0);
        }
#else
        send_retlen = ::send(mSocket->getFD(), sendptr, static_cast<int>(wait_send_size), 0);
#endif
        if (send_retlen <= 0)
        {

#ifdef USE_OPENSSL
            if ((mSSL != nullptr && SSL_get_error(mSSL, send_retlen) == SSL_ERROR_WANT_WRITE) ||
                (sErrno == S_EWOULDBLOCK))
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#else
            if (sErrno == S_EWOULDBLOCK)
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#endif
            break;
        }

        auto tmp_len = static_cast<size_t>(send_retlen);
        for (auto it = mSendList.begin(); it != mSendList.end();)
        {
            auto& packet = *it;
            if (packet.left > tmp_len)
            {
                packet.left -= tmp_len;
                break;
            }

            tmp_len -= packet.left;
            if (packet.mCompleteCallback != nullptr)
            {
                (packet.mCompleteCallback)();
            }
            it = mSendList.erase(it);
        }

        if (send_retlen != wait_send_size)
        {
            mCanWrite = false;
            must_close = !checkWrite();
            break;
        }
    }

    if (must_close)
    {
        procCloseInLoop();
    }
}